

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_write_tile(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                           OPJ_UINT32 p_data_size,opj_stream_private_t *p_stream,
                           opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  opj_tcd *p_tcd;
  ulong uVar3;
  long lVar4;
  
  OVar1 = opj_j2k_pre_write_tile
                    (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                     (opj_event_mgr_t *)CONCAT44(in_register_0000000c,p_data_size));
  if (OVar1 == 0) {
    pcVar2 = "Error while opj_j2k_pre_write_tile with tile index = %d\n";
  }
  else {
    p_tcd = p_j2k->m_tcd;
    if (p_tcd->image->numcomps != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        OVar1 = opj_alloc_tile_component_data
                          ((opj_tcd_tilecomp_t *)((long)&p_tcd->tcd_image->tiles->comps->x0 + lVar4)
                          );
        if (OVar1 == 0) {
          pcVar2 = "Error allocating tile component data.";
          goto LAB_001101e8;
        }
        uVar3 = uVar3 + 1;
        p_tcd = p_j2k->m_tcd;
        lVar4 = lVar4 + 0x40;
      } while (uVar3 < p_tcd->image->numcomps);
    }
    OVar1 = opj_tcd_copy_tile_data(p_tcd,p_data,p_data_size);
    if (OVar1 == 0) {
      pcVar2 = "Size mismatch between tile data and sent data.";
LAB_001101e8:
      opj_event_msg(p_manager,1,pcVar2);
      return 0;
    }
    OVar1 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
    if (OVar1 != 0) {
      return 1;
    }
    pcVar2 = "Error while opj_j2k_post_write_tile with tile index = %d\n";
  }
  opj_event_msg(p_manager,1,pcVar2,p_tile_index);
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_write_tile (opj_j2k_t * p_j2k,
                                                 OPJ_UINT32 p_tile_index,
                                                 OPJ_BYTE * p_data,
                                                 OPJ_UINT32 p_data_size,
                                                 opj_stream_private_t *p_stream,
                                                 opj_event_mgr_t * p_manager )
{
        if (! opj_j2k_pre_write_tile(p_j2k,p_tile_index,p_stream,p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Error while opj_j2k_pre_write_tile with tile index = %d\n", p_tile_index);
                return OPJ_FALSE;
        }
        else {
                OPJ_UINT32 j;
                /* Allocate data */
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_tcd_tilecomp_t* l_tilec = p_j2k->m_tcd->tcd_image->tiles->comps + j;

                        if(! opj_alloc_tile_component_data(l_tilec)) {
												        opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data." );
                                return OPJ_FALSE;
                        }
                }

                /* now copy data into the tile component */
                if (! opj_tcd_copy_tile_data(p_j2k->m_tcd,p_data,p_data_size)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Size mismatch between tile data and sent data." );
                        return OPJ_FALSE;
                }
                if (! opj_j2k_post_write_tile(p_j2k,p_stream,p_manager)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error while opj_j2k_post_write_tile with tile index = %d\n", p_tile_index);
                        return OPJ_FALSE;
                }
        }

        return OPJ_TRUE;
}